

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O2

void __thiscall
xray_re::xr_ogf_v3::partition_io::import
          (partition_io *this,xr_ini_file *ini,char *part_name,xr_ogf_v3 *ogf)

{
  size_t __n;
  xr_bone *pxVar1;
  undefined8 uVar2;
  size_t lindex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator<char> local_71;
  char *bone_name;
  char *local_68;
  xr_ogf_v3 *local_60;
  xr_ini_file *local_58;
  string local_50;
  
  local_60 = ogf;
  local_58 = ini;
  __n = xr_ini_file::line_count(ini,part_name);
  if (__n == 0) {
    msg("empty partition section %s",part_name);
  }
  else {
    local_68 = part_name;
    std::__cxx11::string::assign((char *)&(this->super_xr_partition).m_name);
    this_00 = &(this->super_xr_partition).m_bones;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(this_00,__n);
    lindex = 0;
    while( true ) {
      if (__n == lindex) {
        return;
      }
      xr_ini_file::r_line(local_58,local_68,lindex,&bone_name,(char **)0x0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,bone_name,&local_71);
      pxVar1 = xr_object::find_bone((xr_object *)local_60,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (pxVar1 == (xr_bone *)0x0) break;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,bone_name,&local_71);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &local_50);
      std::__cxx11::string::~string((string *)&local_50);
      lindex = lindex + 1;
    }
    msg("unknown bone %s in partition %s",bone_name,local_68);
  }
  uVar2 = __cxa_allocate_exception(1);
  __cxa_throw(uVar2,&xr_error::typeinfo,0);
}

Assistant:

inline void xr_ogf_v3::partition_io::import(const xr_ini_file& ini, const char* part_name, xr_ogf_v3& ogf)
{
	size_t num_bones = ini.line_count(part_name);
	if (num_bones == 0) {
		msg("empty partition section %s", part_name);
		throw xr_error();
	}

	m_name = part_name;
	m_bones.reserve(num_bones);
	for (size_t i = 0; i != num_bones; ++i) {
		const char* bone_name;
		ini.r_line(part_name, i, &bone_name, 0);
		if (ogf.find_bone(bone_name) == 0) {
			msg("unknown bone %s in partition %s", bone_name, part_name);
			throw xr_error();
		}
		m_bones.push_back(bone_name);
	}
}